

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::DirtyAbsoluteOffsetRecursive(Element *this)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  pointer this_01;
  ulong local_18;
  size_t i;
  Element *this_local;
  
  if ((this->absolute_offset_dirty & 1U) == 0) {
    this->absolute_offset_dirty = true;
    bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->transform_state);
    if (bVar1) {
      DirtyTransformState(this,true,true);
    }
  }
  for (local_18 = 0;
      sVar2 = ::std::
              vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
              ::size(&this->children), local_18 < sVar2; local_18 = local_18 + 1) {
    this_00 = ::std::
              vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
              ::operator[](&this->children,local_18);
    this_01 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(this_00);
    DirtyAbsoluteOffsetRecursive(this_01);
  }
  return;
}

Assistant:

void Element::DirtyAbsoluteOffsetRecursive()
{
	if (!absolute_offset_dirty)
	{
		absolute_offset_dirty = true;

		if (transform_state)
			DirtyTransformState(true, true);
	}

	for (size_t i = 0; i < children.size(); i++)
		children[i]->DirtyAbsoluteOffsetRecursive();
}